

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

void __thiscall
pegmatite::StreamInput::StreamInput(StreamInput *this,string *name,istream *s,size_t len)

{
  pointer pcVar1;
  
  (this->super_Input)._vptr_Input = (_func_int **)&PTR___cxa_pure_virtual_00157af0;
  (this->super_Input).user_name._M_dataplus._M_p = (pointer)&(this->super_Input).user_name.field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_Input).user_name,pcVar1,pcVar1 + name->_M_string_length);
  (this->super_Input).buffer = (char32_t *)0x0;
  (this->super_Input).buffer_start = 1;
  (this->super_Input).buffer_end = 0;
  (this->super_Input)._vptr_Input = (_func_int **)&PTR_fillBuffer_00157b50;
  this->length = len;
  this->stream = s;
  return;
}

Assistant:

StreamInput::StreamInput(const std::string& name, std::istream& s, size_t len)
	: Input(name), length(len), stream(s)
{
}